

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerpTangentPoints.cpp
# Opt level: O2

void GeoCalcs::PerpTangentPoints
               (LLPoint *lineStart,double crs,LLPoint *center,double radius,LLPoint *linePts,
               LLPoint *tanPts,double dTol)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  LLPoint LVar4;
  double dDistFromPt;
  double dCrsFromPt;
  InverseResult result;
  LLPoint perpPt;
  double local_80;
  double local_78;
  double local_70;
  InverseResult local_68;
  double local_50;
  double local_48;
  LLPoint local_40;
  
  local_68.azimuth = 0.0;
  local_68.reverseAzimuth = 0.0;
  local_68.distance = 0.0;
  DistVincenty(lineStart,center,&local_68);
  dVar2 = SignAzimuthDifference(crs,local_68.azimuth);
  if (dTol <= ABS((local_68.azimuth - crs) * local_68.distance)) {
    LVar4 = PerpIntercept(lineStart,crs,center,&local_70,&local_80,dTol);
    local_40.longitude = LVar4.longitude;
    local_40.latitude = LVar4.latitude;
    DistVincenty(&local_40,lineStart,&local_68);
    dVar3 = 0.0;
    local_48 = local_68.azimuth;
    local_50 = local_68.azimuth + 3.141592653589793;
    uVar1 = 0;
    local_78 = *(double *)(&DAT_00159210 + (ulong)(0.0 <= dVar2) * 8) * 1.5707963267948966;
    dVar2 = radius;
    while ((uVar1 == 0 || ((uVar1 < 0xf && (dTol < ABS(dVar3)))))) {
      LVar4 = DestVincenty(&local_40,local_50,dVar2);
      linePts->latitude = LVar4.latitude;
      linePts->longitude = LVar4.longitude;
      DistVincenty(linePts,&local_40,&local_68);
      LVar4 = PerpIntercept(linePts,local_68.azimuth + local_78,center,&local_70,&local_80,dTol);
      tanPts->latitude = LVar4.latitude;
      tanPts->longitude = LVar4.longitude;
      dVar3 = local_80 - radius;
      dVar2 = dVar2 - dVar3;
      uVar1 = uVar1 + 1;
    }
    dVar3 = 0.0;
    uVar1 = 0;
    while ((uVar1 == 0 || ((uVar1 < 0xf && (dTol < ABS(dVar3)))))) {
      LVar4 = DestVincenty(&local_40,local_48,dVar2);
      linePts[1].latitude = LVar4.latitude;
      linePts[1].longitude = LVar4.longitude;
      DistVincenty(linePts + 1,&local_40,&local_68);
      LVar4 = PerpIntercept(linePts + 1,local_68.azimuth + local_78,center,&local_70,&local_80,dTol)
      ;
      tanPts[1].latitude = LVar4.latitude;
      tanPts[1].longitude = LVar4.longitude;
      dVar3 = local_80 - radius;
      dVar2 = dVar2 - dVar3;
      uVar1 = uVar1 + 1;
    }
  }
  else {
    LVar4 = DestVincenty(lineStart,crs,local_68.distance - radius);
    tanPts->latitude = LVar4.latitude;
    tanPts->longitude = LVar4.longitude;
    LVar4 = DestVincenty(lineStart,crs,radius + local_68.distance);
    tanPts[1].latitude = LVar4.latitude;
    tanPts[1].longitude = LVar4.longitude;
    dVar2 = tanPts->longitude;
    linePts->latitude = tanPts->latitude;
    linePts->longitude = dVar2;
    dVar2 = tanPts[1].longitude;
    linePts[1].latitude = tanPts[1].latitude;
    linePts[1].longitude = dVar2;
  }
  return;
}

Assistant:

void PerpTangentPoints(const LLPoint &lineStart, double crs,
                           const LLPoint &center, double radius,
                           LLPoint *linePts, LLPoint *tanPts, double dTol)
    {
        InverseResult result;
        DistVincenty(lineStart, center, result);
        const double signAngle1 = SignAzimuthDifference(crs, result.azimuth) >= 0.0 ? 1.0 : -1.0;

        if (fabs(result.distance * (result.azimuth - crs)) < dTol)
        {
            tanPts[0] = DestVincenty(lineStart, crs, result.distance - radius);
            tanPts[1] = DestVincenty(lineStart, crs, result.distance + radius);
            linePts[0] = tanPts[0];
            linePts[1] = tanPts[1];
            return;
        }

        double dCrsFromPt, dDistFromPt;
        LLPoint perpPt = PerpIntercept(lineStart, crs, center, dCrsFromPt, dDistFromPt, dTol);

        DistVincenty(perpPt, lineStart, result);
        const double crs21 = result.azimuth;

        double delta = radius;
        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            linePts[0] = DestVincenty(perpPt, crs21 + M_PI, delta);
            DistVincenty(linePts[0], perpPt, result);

            tanPts[0] = PerpIntercept(linePts[0], result.azimuth - signAngle1 * M_PI_2,
                                      center, dCrsFromPt, dDistFromPt, dTol);
            dErr = dDistFromPt - radius;
            delta = delta - dErr;
            k++;
        }

        dErr = 0.0;
        k = 0;
        while (k == 0 || (fabs(dErr) > dTol && k < maxCount))
        {
            linePts[1] = DestVincenty(perpPt, crs21, delta);
            DistVincenty(linePts[1], perpPt, result);

            tanPts[1] = PerpIntercept(linePts[1], result.azimuth - signAngle1 * M_PI_2,
                                      center, dCrsFromPt, dDistFromPt, dTol);
            dErr = dDistFromPt - radius;
            delta = delta - dErr;
            k++;
        }

        return;
    }